

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<128U,_2U,_buffer_layout_bfs>::operator()
          (fill<128U,_2U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long uVar1;
  uchar *puVar2;
  uchar *__s2;
  array<unsigned_long,_128UL> *paVar3;
  int iVar4;
  ostream *poVar5;
  size_t sVar6;
  unsigned_long *puVar7;
  long lVar8;
  long lVar9;
  unsigned_long *puVar10;
  DI __d;
  size_t local_68;
  fill<128U,_4U,_buffer_layout_bfs> local_5c;
  fill<128U,_5U,_buffer_layout_bfs> local_5b;
  fill<128U,_5U,_buffer_layout_bfs> local_5a;
  fill<128U,_4U,_buffer_layout_bfs> local_59;
  size_t local_58;
  array<Stream,_128UL> *local_50;
  unsigned_long *local_48;
  DI local_40;
  array<unsigned_long,_128UL> *local_38;
  
  local_50 = streams;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fill_inner",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", inner, I=",0xb);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  local_40.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  local_48 = buffer_count->_M_elems + 4;
  puVar10 = buffer_count->_M_elems + 5;
  local_58 = 0;
  local_68 = 0;
  local_38 = buffer_count;
  do {
    paVar3 = local_38;
    puVar7 = local_48;
    if ((*local_48 == 0) &&
       (fill<128U,_4U,_buffer_layout_bfs>::operator()(&local_59,local_50,buffer,local_38),
       *puVar7 == 0)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"left stream drained\n",0x14);
      lVar9 = -0x40 - local_58;
      lVar8 = 8 - local_68;
      goto LAB_0015d3b4;
    }
    if ((*puVar10 == 0) &&
       (fill<128U,_5U,_buffer_layout_bfs>::operator()(&local_5a,local_50,buffer,paVar3),
       *puVar10 == 0)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"right stream drained\n",0x15);
      local_58 = -local_58;
      local_68 = -local_68;
      puVar10 = local_48;
      goto LAB_0015d495;
    }
    lVar8 = -*puVar7;
    uVar1 = *puVar10;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"L:\'",3);
    puVar2 = buffer[lVar8 + 0x50];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)poVar5 + -0x18) + (int)poVar5);
    }
    else {
      sVar6 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\', R:\'",6);
    puVar2 = buffer[-uVar1 + 0x90];
    if (puVar2 == (uchar *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar6 = strlen((char *)puVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)puVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
    puVar2 = buffer[lVar8 + 0x50];
    if (puVar2 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[-uVar1 + 0x90];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar4 = strcmp((char *)puVar2,(char *)__s2);
    puVar7 = puVar10;
    if (iVar4 < 1) {
      puVar7 = local_48;
      __s2 = puVar2;
    }
    buffer[local_68] = __s2;
    *puVar7 = *puVar7 - 1;
    check_input(buffer,local_68);
    paVar3 = local_38;
    local_68 = local_68 + 1;
    local_58 = local_58 - 8;
  } while (local_68 != 8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Done, buffer filled\n",0x14);
  paVar3->_M_elems[2] = 8;
  goto LAB_0015d5f0;
  while( true ) {
    uVar1 = paVar3->_M_elems[5];
    buffer[local_68] = buffer[0x90 - uVar1];
    paVar3->_M_elems[5] = uVar1 - 1;
    lVar8 = lVar8 + -1;
    local_68 = local_68 + 1;
    lVar9 = lVar9 + 8;
    if (lVar9 == 0) break;
LAB_0015d3b4:
    if ((paVar3->_M_elems[5] == 0) &&
       (fill<128U,_5U,_buffer_layout_bfs>::operator()(&local_5b,local_50,buffer,paVar3),
       paVar3->_M_elems[5] == 0)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"both streams prematurely drained\n",0x21);
      memmove(buffer + lVar8,buffer,lVar9 + 0x40);
      paVar3->_M_elems[2] = local_68;
      check_input((uchar **)((long)buffer - lVar9),local_68);
      goto LAB_0015d5f0;
    }
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tbuffer filled\n",0xf);
  paVar3->_M_elems[2] = 8;
  check_input(buffer,8);
  goto LAB_0015d5f0;
  while( true ) {
    uVar1 = *puVar10;
    *(uchar **)((long)buffer + local_58) = buffer[0x50 - uVar1];
    *puVar10 = uVar1 - 1;
    local_68 = local_68 + -1;
    local_58 = local_58 + 8;
    if (local_58 == 0x40) break;
LAB_0015d495:
    if ((*puVar10 == 0) &&
       (fill<128U,_4U,_buffer_layout_bfs>::operator()(&local_5c,local_50,buffer,paVar3),
       puVar10 = local_48, *local_48 == 0)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"both streams prematurely drained\n",0x21);
      lVar8 = 0x40 - local_58;
      memmove(buffer + local_68 + 8,buffer,local_58);
      paVar3->_M_elems[2] = -local_68;
      check_input((uchar **)((long)buffer + lVar8),-local_68);
      goto LAB_0015d5f0;
    }
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"buffer filled\n",0xe);
  paVar3->_M_elems[2] = 8;
  check_input(buffer,8);
LAB_0015d5f0:
  anon_func::DI::~DI(&local_40);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}